

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

SUNErrCode N_VScaleAddMulti_ManyVector(int nvec,sunrealtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  size_t __size;
  void *__ptr;
  void *__ptr_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  
  __size = (long)nvec * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  plVar1 = (long *)x->content;
  if (0 < *plVar1) {
    lVar3 = 0;
    do {
      if (0 < nvec) {
        lVar2 = 0;
        do {
          *(undefined8 *)((long)__ptr + lVar2 * 8) =
               *(undefined8 *)(*(long *)((long)Y[lVar2]->content + 0x10) + lVar3 * 8);
          *(undefined8 *)((long)__ptr_00 + lVar2 * 8) =
               *(undefined8 *)(*(long *)((long)Z[lVar2]->content + 0x10) + lVar3 * 8);
          lVar2 = lVar2 + 1;
        } while (nvec != lVar2);
      }
      N_VScaleAddMulti(nvec,a,*(undefined8 *)(plVar1[2] + lVar3 * 8),__ptr,__ptr_00);
      lVar3 = lVar3 + 1;
      plVar1 = (long *)x->content;
    } while (lVar3 < *plVar1);
  }
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VScaleAddMulti)(int nvec, sunrealtype* a, N_Vector x,
                                      N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, j;
  N_Vector *Ysub, *Zsub;

  /* create arrays of nvec N_Vector pointers for reuse within loop */
  Ysub = Zsub = NULL;
  Ysub        = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Ysub, SUN_ERR_MALLOC_FAIL);
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VScaleAddMulti for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* for each subvector, create the array of subvectors of Y and Z */
    for (j = 0; j < nvec; j++)
    {
      Ysub[j] = MANYVECTOR_SUBVEC(Y[j], i);
      Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i);
    }

    /* now call N_VScaleAddMulti for this array of subvectors */
    SUNCheckCall(N_VScaleAddMulti(nvec, a, MANYVECTOR_SUBVEC(x, i), Ysub, Zsub));
  }

  /* clean up and return */
  free(Ysub);
  free(Zsub);
  return SUN_SUCCESS;
}